

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O3

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Merge
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint a,uint b)

{
  uint uVar1;
  uint **ppuVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (a == b) {
    return;
  }
  if (a < this->maxIndex) {
    uVar4 = a >> 4;
    if (this->backingStore[uVar4] == (uint *)0x0) goto LAB_003f07ac;
    uVar5 = a & 0xf;
    uVar1 = this->backingStore[uVar4][uVar5];
    if (uVar1 != a) {
      a = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,false>
                    ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,uVar1);
      this->backingStore[uVar4][uVar5] = a;
    }
  }
  else {
LAB_003f07ac:
    CreateBacking(this,a);
  }
  if (b < this->maxIndex) {
    uVar4 = b >> 4;
    if (this->backingStore[uVar4] == (uint *)0x0) goto LAB_003f07f9;
    uVar5 = b & 0xf;
    uVar1 = this->backingStore[uVar4][uVar5];
    if (uVar1 != b) {
      b = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,false>
                    ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,uVar1);
      this->backingStore[uVar4][uVar5] = b;
    }
  }
  else {
LAB_003f07f9:
    CreateBacking(this,b);
  }
  uVar4 = b;
  if (a < b) {
    uVar4 = a;
  }
  if (a < this->maxIndex) {
    ppuVar2 = this->backingStore;
    uVar6 = (ulong)(a >> 4);
    puVar3 = ppuVar2[uVar6];
    if (puVar3 != (uint *)0x0) goto LAB_003f0843;
  }
  else {
    uVar6 = (ulong)(a >> 4);
  }
  CreateBacking(this,a);
  ppuVar2 = this->backingStore;
  puVar3 = ppuVar2[uVar6];
LAB_003f0843:
  puVar3[a & 0xf] = uVar4;
  if ((this->maxIndex <= b) || (puVar3 = ppuVar2[b >> 4], puVar3 == (uint *)0x0)) {
    CreateBacking(this,b);
    puVar3 = this->backingStore[b >> 4];
  }
  puVar3[b & 0xf] = uVar4;
  if (a != b) {
    this->consolidated = false;
  }
  return;
}

Assistant:

void Merge(indexType a, indexType b)
    {
        if (a == b)
            return;
        indexType aVal = Lookup<true>(a);
        indexType bVal = Lookup<true>(b);
        indexType min = (aVal < bVal ? aVal : bVal);
        // We need to update the roots of both branches to point to the min
        Assign<false>(aVal, min);
        Assign<false>(bVal, min);
#if DBG
        if(aVal != min || bVal != min)
            consolidated = false;
#endif
    }